

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nest_One_IAF_SNN_Results.cpp
# Opt level: O3

int main(void)

{
  run();
  return 0;
}

Assistant:

int main() 
{
    try {
        return run();
    }
    catch (int param) { cout << "int exception"; }
    catch (char param) { cout << "char exception"; }
    catch (...) { cout << "default exception"; }
}